

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ModAsyncify<true,_false,_true>::create(ModAsyncify<true,_false,_true> *this)

{
  unique_ptr<wasm::ModAsyncify<true,_false,_true>,_std::default_delete<wasm::ModAsyncify<true,_false,_true>_>_>
  local_20 [2];
  ModAsyncify<true,_false,_true> *this_local;
  
  this_local = this;
  std::make_unique<wasm::ModAsyncify<true,false,true>>();
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::ModAsyncify<true,false,true>,std::default_delete<wasm::ModAsyncify<true,false,true>>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::
  unique_ptr<wasm::ModAsyncify<true,_false,_true>,_std::default_delete<wasm::ModAsyncify<true,_false,_true>_>_>
  ::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<
      ModAsyncify<neverRewind, neverUnwind, importsAlwaysUnwind>>();
  }